

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_process_sod(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *tile_00;
  byte *pbVar1;
  int iVar2;
  jas_stream_t *pjVar3;
  long lVar4;
  uint local_5c;
  uint local_58;
  uint local_54;
  jas_stream_t *local_50;
  long local_40;
  uint_fast32_t n;
  long curoff;
  int pos;
  jpc_dec_tile_t *tile;
  jpc_ms_t *ms_local;
  jpc_dec_t *dec_local;
  
  tile_00 = dec->curtile;
  if (tile_00 == (jpc_dec_tile_t *)0x0) {
    return -1;
  }
  if (tile_00->partno == 0) {
    iVar2 = jpc_dec_cp_isvalid(tile_00->cp);
    if (iVar2 == 0) {
      return -1;
    }
    iVar2 = jpc_dec_cp_prepare(tile_00->cp);
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = jpc_dec_tileinit(dec,tile_00);
    if (iVar2 != 0) {
      return -1;
    }
  }
  if (dec->pkthdrstreams != (jpc_streamlist_t *)0x0) {
    pjVar3 = jpc_streamlist_remove(dec->pkthdrstreams,0);
    tile_00->pkthdrstream = pjVar3;
    if (pjVar3 == (jas_stream_t *)0x0) {
      return -1;
    }
  }
  if (tile_00->pptstab != (jpc_ppxstab_t *)0x0) {
    if (tile_00->pkthdrstream == (jas_stream_t *)0x0) {
      pjVar3 = jas_stream_memopen((char *)0x0,0);
      tile_00->pkthdrstream = pjVar3;
      if (pjVar3 == (jas_stream_t *)0x0) {
        return -1;
      }
    }
    lVar4 = jas_stream_tell(tile_00->pkthdrstream);
    jas_stream_seek(tile_00->pkthdrstream,0,2);
    iVar2 = jpc_pptstabwrite(tile_00->pkthdrstream,tile_00->pptstab);
    if (iVar2 != 0) {
      return -1;
    }
    jas_stream_seek(tile_00->pkthdrstream,(long)(int)lVar4,0);
    jpc_ppxstab_destroy(tile_00->pptstab);
    tile_00->pptstab = (jpc_ppxstab_t *)0x0;
  }
  iVar2 = jas_getdbglevel();
  if (9 < iVar2) {
    jpc_dec_dump(dec,_stderr);
  }
  if (tile_00->pkthdrstream == (jas_stream_t *)0x0) {
    local_50 = dec->in;
  }
  else {
    local_50 = tile_00->pkthdrstream;
  }
  iVar2 = jpc_dec_decodepkts(dec,local_50,dec->in);
  if (iVar2 == 0) {
    if (0 < dec->curtileendoff) {
      local_40 = dec->in->rwcnt_;
      if (local_40 < dec->curtileendoff) {
        local_40 = dec->curtileendoff - local_40;
        jas_eprintf("warning: ignoring trailing garbage (%lu bytes)\n",local_40);
        while (local_40 != 0) {
          if ((dec->in->flags_ & 7U) == 0) {
            if ((dec->in->rwlimit_ < 0) || (dec->in->rwcnt_ < dec->in->rwlimit_)) {
              iVar2 = dec->in->cnt_ + -1;
              dec->in->cnt_ = iVar2;
              if (iVar2 < 0) {
                local_58 = jas_stream_fillbuf(dec->in,1);
              }
              else {
                dec->in->rwcnt_ = dec->in->rwcnt_ + 1;
                pbVar1 = dec->in->ptr_;
                dec->in->ptr_ = pbVar1 + 1;
                local_58 = (uint)*pbVar1;
              }
              local_54 = local_58;
            }
            else {
              dec->in->flags_ = dec->in->flags_ | 4;
              local_54 = 0xffffffff;
            }
            local_5c = local_54;
          }
          else {
            local_5c = 0xffffffff;
          }
          local_40 = local_40 + -1;
          if (local_5c == 0xffffffff) {
            jas_eprintf("read error\n");
            return -1;
          }
        }
      }
      else if (dec->curtileendoff < local_40) {
        jas_eprintf("warning: not enough tile data (%lu bytes)\n",local_40 - dec->curtileendoff);
      }
    }
    if ((0 < tile_00->numparts) && (tile_00->partno == tile_00->numparts + -1)) {
      iVar2 = jpc_dec_tiledecode(dec,tile_00);
      if (iVar2 != 0) {
        return -1;
      }
      jpc_dec_tilefini(dec,tile_00);
    }
    dec->curtile = (jpc_dec_tile_t *)0x0;
    tile_00->partno = tile_00->partno + 1;
    dec->state = 8;
    dec_local._4_4_ = 0;
  }
  else {
    jas_eprintf("jpc_dec_decodepkts failed\n");
    dec_local._4_4_ = -1;
  }
  return dec_local._4_4_;
}

Assistant:

static int jpc_dec_process_sod(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_dec_tile_t *tile;
	int pos;

	/* Eliminate compiler warnings about unused variables. */
	(void)ms;

	if (!(tile = dec->curtile)) {
		return -1;
	}

	if (!tile->partno) {
		if (!jpc_dec_cp_isvalid(tile->cp)) {
			return -1;
		}
		if (jpc_dec_cp_prepare(tile->cp)) {
			return -1;
		}
		if (jpc_dec_tileinit(dec, tile)) {
			return -1;
		}
	}

	/* Are packet headers stored in the main header or tile-part header? */
	if (dec->pkthdrstreams) {
		/* Get the stream containing the packet header data for this
		  tile-part. */
		if (!(tile->pkthdrstream = jpc_streamlist_remove(dec->pkthdrstreams, 0))) {
			return -1;
		}
	}

	if (tile->pptstab) {
		if (!tile->pkthdrstream) {
			if (!(tile->pkthdrstream = jas_stream_memopen(0, 0))) {
				return -1;
			}
		}
		pos = jas_stream_tell(tile->pkthdrstream);
		jas_stream_seek(tile->pkthdrstream, 0, SEEK_END);
		if (jpc_pptstabwrite(tile->pkthdrstream, tile->pptstab)) {
			return -1;
		}
		jas_stream_seek(tile->pkthdrstream, pos, SEEK_SET);
		jpc_ppxstab_destroy(tile->pptstab);
		tile->pptstab = 0;
	}

	if (jas_getdbglevel() >= 10) {
		jpc_dec_dump(dec, stderr);
	}

	if (jpc_dec_decodepkts(dec, (tile->pkthdrstream) ? tile->pkthdrstream :
	  dec->in, dec->in)) {
		jas_eprintf("jpc_dec_decodepkts failed\n");
		return -1;
	}

	/* Gobble any unconsumed tile data. */
	if (dec->curtileendoff > 0) {
		long curoff;
		uint_fast32_t n;
		curoff = jas_stream_getrwcount(dec->in);
		if (curoff < dec->curtileendoff) {
			n = dec->curtileendoff - curoff;
			jas_eprintf("warning: ignoring trailing garbage (%lu bytes)\n",
			  (unsigned long) n);

			while (n-- > 0) {
				if (jas_stream_getc(dec->in) == EOF) {
					jas_eprintf("read error\n");
					return -1;
				}
			}
		} else if (curoff > dec->curtileendoff) {
			jas_eprintf("warning: not enough tile data (%lu bytes)\n",
			  (unsigned long) curoff - dec->curtileendoff);
		}

	}

	if (tile->numparts > 0 && tile->partno == tile->numparts - 1) {
		if (jpc_dec_tiledecode(dec, tile)) {
			return -1;
		}
		jpc_dec_tilefini(dec, tile);
	}

	dec->curtile = 0;

	/* Increment the expected tile-part number. */
	++tile->partno;

	/* We should expect to encounter a SOT marker segment next. */
	dec->state = JPC_TPHSOT;

	return 0;
}